

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O2

int __thiscall
axl::sl::Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::copy
          (Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  int iVar1;
  
  if (dst != (EVP_PKEY_CTX *)this) {
    if (*(EVP_PKEY_CTX **)(dst + 0x10) == (EVP_PKEY_CTX *)0x0) {
      clear(this);
      return 0;
    }
    if ((*(long *)(dst + 8) == 0) || ((*(byte *)(*(long *)(dst + 8) + 0x20) & 4) != 0)) {
      iVar1 = copy(this,*(EVP_PKEY_CTX **)dst,*(EVP_PKEY_CTX **)(dst + 0x10));
      return iVar1;
    }
    ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::attach
              (&this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>,
               (ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *)dst);
  }
  return (int)(this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_count;
}

Assistant:

size_t
	copy(const ArrayRef& src) {
		if (&src == this)
			return this->m_count;

		if (src.isEmpty()) {
			clear();
			return 0;
		}

		Hdr* hdr = src.getHdr();
		if (!hdr || (hdr->m_flags & rc::BufHdrFlag_Exclusive))
			return copy(src, src.getCount());

		this->attach(src);
		return this->m_count;
	}